

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::drawItemHelper
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QStyleOptionGraphicsItem *option,QWidget *widget,bool painterStateProtection)

{
  QGraphicsItemPrivate *this_00;
  QWidgetData *pQVar1;
  ExtraStruct *pEVar2;
  QPoint QVar3;
  qreal qVar4;
  qreal qVar5;
  undefined1 auVar6 [16];
  QRect QVar7;
  QRect QVar8;
  QRect QVar9;
  QRect QVar10;
  Key KVar11;
  bool bVar12;
  char cVar13;
  char cVar14;
  int iVar15;
  int iVar16;
  RenderHints RVar17;
  undefined4 uVar18;
  undefined4 extraout_EAX;
  QGraphicsProxyWidget *this_01;
  QWidget *pQVar19;
  QGraphicsItemCache *pQVar20;
  undefined8 uVar21;
  DeviceData *pDVar22;
  QTransform *pQVar23;
  qreal *pqVar24;
  undefined7 extraout_var;
  qreal *pqVar25;
  long lVar26;
  Representation RVar27;
  long lVar28;
  int iVar29;
  QRectF *rect_2;
  int iVar30;
  Representation RVar31;
  ExtraStruct *pEVar32;
  undefined8 *puVar33;
  QGraphicsItem *pQVar34;
  QSize QVar35;
  code **ppcVar36;
  DeviceData *pDVar37;
  QRectF *rect;
  int iVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  QRectF *rect_1;
  long in_FS_OFFSET;
  bool bVar42;
  byte bVar43;
  ulong uVar44;
  int iVar45;
  double c;
  double dVar46;
  qreal qVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar50 [16];
  int iVar55;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar56;
  double dVar57;
  double dVar59;
  undefined1 auVar58 [16];
  uint uVar60;
  double dVar61;
  undefined1 auVar62 [16];
  QRegion pixmapExposed_1;
  QRegion scrollExposure;
  bool invertable;
  QRegion pixmapExposed;
  Key pixmapKey;
  QRegion exposed;
  QTransform pixmapToItem;
  QTransform restoreTransform;
  QTransform itemToPixmap;
  Representation local_2a8;
  Representation RStack_2a4;
  QSize local_238;
  double local_230;
  double local_228;
  double local_220;
  undefined1 local_218 [24];
  qreal qStack_200;
  QRegion local_1f0;
  QRegion local_1e8;
  char local_1d9;
  QRect local_1d8;
  QRect local_1c8;
  QRectF local_1b8;
  undefined1 *local_198;
  undefined1 *puStack_190;
  undefined1 *local_188;
  Key local_180;
  Representation local_178;
  Representation RStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  QRectF local_158;
  QTransform local_138;
  QTransform local_e8;
  code *local_98 [3];
  undefined8 local_80;
  ushort local_50;
  Key local_40;
  long local_38;
  
  QVar9._8_8_ = local_1c8._8_8_;
  QVar9._0_8_ = local_1c8._0_8_;
  bVar43 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (item->d_ptr).d;
  uVar39 = *(uint *)&this_00->field_0x160 >> 0x15 & 3;
  if (uVar39 == 0) {
    pQVar34 = item + -1;
    if (item == (QGraphicsItem *)0x0) {
      pQVar34 = (QGraphicsItem *)0x0;
    }
    pQVar34 = pQVar34 + 1;
    if (item == (QGraphicsItem *)0x0) {
      pQVar34 = (QGraphicsItem *)0x0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _q_paintItem(pQVar34,painter,option,widget,true,painterStateProtection);
      return;
    }
    goto LAB_00619b85;
  }
  QPainter::device();
  c = (double)QPaintDevice::devicePixelRatio();
  dVar46 = (double)QPainter::opacity();
  bVar12 = QGraphicsItem::isWidget(item);
  if (bVar12) {
    this_01 = (QGraphicsProxyWidget *)
              QMetaObject::cast((QObject *)&QGraphicsProxyWidget::staticMetaObject);
  }
  else {
    this_01 = (QGraphicsProxyWidget *)0x0;
  }
  dVar48 = dVar46;
  if ((this_01 != (QGraphicsProxyWidget *)0x0) &&
     (pQVar19 = QGraphicsProxyWidget::widget(this_01), pQVar19 != (QWidget *)0x0)) {
    pQVar19 = QGraphicsProxyWidget::widget(this_01);
    qVar47 = QWidget::windowOpacity(pQVar19);
    dVar48 = (double)(~-(ulong)(qVar47 < 1.0) & (ulong)dVar46 |
                     (ulong)(dVar46 * qVar47) & -(ulong)(qVar47 < 1.0));
  }
  local_168 = 0xffffffff;
  uStack_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  local_178.m_i = -1;
  RStack_174.m_i = -1;
  uStack_170 = 0xffffffff;
  uStack_16c = 0xffffffff;
  (*item->_vptr_QGraphicsItem[3])(&local_178,item);
  QVar10.x2.m_i = local_1c8.x2.m_i;
  QVar10.y2.m_i = local_1c8.y2.m_i;
  QVar10.x1.m_i = local_1c8.x1.m_i;
  QVar10.y1.m_i = local_1c8.y1.m_i;
  QVar9.x2.m_i = local_1c8.x2.m_i;
  QVar9.y2.m_i = local_1c8.y2.m_i;
  QVar9.x1.m_i = local_1c8.x1.m_i;
  QVar9.y1.m_i = local_1c8.y1.m_i;
  auVar62._8_8_ = local_158.yp;
  auVar62._0_8_ = local_158.xp;
  uVar44 = -(ulong)((double)CONCAT44(uStack_164,local_168) != 0.0);
  if ((0.0 <= (double)(uVar44 & CONCAT44(uStack_15c,uStack_160) |
                      ~uVar44 & (ulong)((double)CONCAT44(uStack_15c,uStack_160) + 0.0))) &&
     (local_158._0_16_ = auVar62, QVar9 = QVar10, 0.0 <= (double)CONCAT44(uStack_164,local_168))) {
    local_180.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
    QPixmapCache::Key::Key(&local_180);
    local_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_198 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_190 = &DAT_aaaaaaaaaaaaaaaa;
    QPixmap::QPixmap((QPixmap *)&local_198);
    pQVar20 = QGraphicsItemPrivate::extraItemCache(this_00);
    if (uVar39 == 1) {
      QPixmapCache::Key::operator=(&local_180,&pQVar20->key);
    }
    else {
      local_e8.m_matrix[0][0] = (qreal)&widget->super_QPaintDevice;
      if (widget == (QWidget *)0x0) {
        local_e8.m_matrix[0][0]._0_4_ = 0;
        local_e8.m_matrix[0][0]._4_4_ = 0;
      }
      QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::value
                ((DeviceData *)local_98,&pQVar20->deviceData,(QPaintDevice **)&local_e8);
      KVar11.d = local_180.d;
      local_180.d = local_40.d;
      local_40.d = KVar11.d;
      QPixmapCache::Key::~Key(&local_40);
    }
    cVar13 = QPixmapCache::find(&local_180,(QPixmap *)&local_198);
    QVar8.x2.m_i = local_1c8.x2.m_i;
    QVar8.y2.m_i = local_1c8.y2.m_i;
    QVar8.x1.m_i = local_1c8.x1.m_i;
    QVar8.y1.m_i = local_1c8.y1.m_i;
    if (uVar39 == 1) {
      uVar39 = (pQVar20->fixedSize).ht.m_i;
      uVar60 = (pQVar20->fixedSize).wd.m_i;
      auVar62 = QRectF::toAlignedRect();
      bVar42 = (int)(uVar60 | uVar39) < 0;
      bVar12 = !bVar42;
      if (bVar42) {
        QVar35.wd.m_i = (auVar62._8_4_ - auVar62._0_4_) + 1;
        QVar35.ht.m_i = (auVar62._12_4_ - auVar62._4_4_) + 1;
      }
      else {
        QVar35 = pQVar20->fixedSize;
      }
      dVar57 = c * (double)QVar35.ht.m_i.m_i;
      dVar59 = c * (double)QVar35.wd.m_i.m_i;
      auVar50._0_8_ = (double)((ulong)dVar57 & 0x8000000000000000 | 0x3fe0000000000000) + dVar57;
      auVar50._8_8_ = (double)((ulong)dVar59 & 0x8000000000000000 | 0x3fe0000000000000) + dVar59;
      auVar58 = minpd(_DAT_0066f5d0,auVar50);
      auVar58 = maxpd(auVar58,_DAT_0066f5e0);
      iVar45 = (int)auVar58._0_8_;
      iVar55 = (int)auVar58._8_8_;
      uVar39 = (pQVar20->fixedSize).ht.m_i | (pQVar20->fixedSize).wd.m_i;
      iVar15 = (int)uVar39 >> 0x1f;
      dVar57 = 0.0;
      if ((int)uVar39 < 0) {
        dVar57 = -2.0;
      }
      iVar29 = iVar15 * -4;
      iVar15 = (int)((double)(iVar15 * -2) / c);
      iVar30 = auVar62._0_4_ + (int)(dVar57 / c);
      iVar40 = auVar62._4_4_ + (int)(dVar57 / c);
      iVar38 = auVar62._8_4_ + iVar15;
      iVar15 = auVar62._12_4_ + iVar15;
      cVar14 = QPixmap::isNull();
      if (cVar14 == '\0') {
        if (!bVar12) {
          uVar21 = QPixmap::size();
          iVar16 = (int)((ulong)uVar21 >> 0x20);
          auVar51._0_4_ = -(uint)(iVar16 == iVar29 + iVar45);
          auVar51._4_4_ = -(uint)(iVar16 == iVar29 + iVar45);
          auVar51._8_4_ = -(uint)((int)uVar21 == iVar29 + iVar55);
          auVar51._12_4_ = -(uint)((int)uVar21 == iVar29 + iVar55);
          iVar16 = movmskpd(iVar16,auVar51);
          if (iVar16 != 3) goto LAB_00618869;
        }
        if (((((pQVar20->boundingRect).x1.m_i != iVar30) ||
             ((pQVar20->boundingRect).x2.m_i != iVar38)) ||
            ((pQVar20->boundingRect).y1.m_i != iVar40)) ||
           ((pQVar20->boundingRect).y2.m_i != iVar15)) goto LAB_00618993;
      }
      else {
LAB_00618869:
        local_138.m_matrix[0][0]._0_4_ = iVar55 + iVar29;
        local_138.m_matrix[0][0]._4_4_ = iVar29 + iVar45;
        QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)&local_138);
        local_98[2] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        local_98[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintDevice::QPaintDevice((QPaintDevice *)local_98);
        qVar47 = local_e8.m_matrix[0][2];
        local_98[2] = (code *)local_188;
        local_98[0] = QDataStream::operator<<;
        local_e8.m_matrix[0][2] = 0.0;
        local_188 = (undefined1 *)qVar47;
        QPixmap::~QPixmap((QPixmap *)local_98);
        QPixmap::~QPixmap((QPixmap *)&local_e8);
LAB_00618993:
        (pQVar20->boundingRect).x1 = (Representation)iVar30;
        (pQVar20->boundingRect).y1 = (Representation)iVar40;
        (pQVar20->boundingRect).x2 = (Representation)iVar38;
        (pQVar20->boundingRect).y2 = (Representation)iVar15;
        QList<QRectF>::clear(&pQVar20->exposed);
        pQVar20->allExposed = true;
      }
      if ((pQVar20->allExposed != false) || ((pQVar20->exposed).d.size != 0)) {
        if (cVar13 != '\0') {
          QPixmapCache::remove(&local_180);
        }
        puVar33 = &DAT_00702c58;
        ppcVar36 = local_98;
        for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
          *ppcVar36 = (code *)*puVar33;
          puVar33 = puVar33 + (ulong)bVar43 * -2 + 1;
          ppcVar36 = ppcVar36 + (ulong)bVar43 * -2 + 1;
        }
        puVar33 = &DAT_00702c10;
        ppcVar36 = local_98;
        for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
          *ppcVar36 = (code *)*puVar33;
          puVar33 = puVar33 + (ulong)bVar43 * -2 + 1;
          ppcVar36 = ppcVar36 + (ulong)bVar43 * -2 + 1;
        }
        local_50 = local_50 & 0xfc00;
        if (bVar12) {
          QTransform::scale(((double)iVar55 / c) / (double)CONCAT44(uStack_164,local_168),
                            ((double)iVar45 / c) / (double)CONCAT44(uStack_15c,uStack_160));
        }
        QTransform::translate((double)-iVar30,(double)-iVar40);
        QStyleOption::operator=
                  (&(this->styleOptionTmp).super_QStyleOption,&option->super_QStyleOption);
        qVar47 = (option->exposedRect).yp;
        qVar4 = (option->exposedRect).w;
        qVar5 = (option->exposedRect).h;
        (this->styleOptionTmp).exposedRect.xp = (option->exposedRect).xp;
        (this->styleOptionTmp).exposedRect.yp = qVar47;
        (this->styleOptionTmp).exposedRect.w = qVar4;
        (this->styleOptionTmp).exposedRect.h = qVar5;
        local_1b8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion((QRegion *)&local_1b8);
        auVar6._8_8_ = local_158.yp;
        auVar6._0_8_ = local_158.xp;
        local_138.m_matrix[0][0] = 0.0;
        local_138.m_matrix[0][1] = 0.0;
        local_138.m_matrix[0][2] = 0.0;
        local_138.m_matrix[1][0] = 0.0;
        if (pQVar20->allExposed == false) {
          lVar28 = (pQVar20->exposed).d.size;
          if (lVar28 != 0) {
            lVar28 = lVar28 << 5;
            do {
              QRectF::operator|((QRectF *)&local_e8,(QRectF *)&local_138);
              local_138.m_matrix[0][2] = local_e8.m_matrix[0][2];
              local_138.m_matrix[1][0] = local_e8.m_matrix[1][0];
              local_138.m_matrix[0][0] = local_e8.m_matrix[0][0];
              local_138.m_matrix[0][1] = local_e8.m_matrix[0][1];
              QTransform::mapRect((QRectF *)&local_e8);
              auVar62 = QRectF::toAlignedRect();
              local_158._0_16_ = auVar62;
              QRegion::operator+=((QRegion *)&local_1b8,(QRect *)&local_158);
              lVar28 = lVar28 + -0x20;
            } while (lVar28 != 0);
          }
        }
        else {
          local_138.m_matrix[0][0]._4_4_ = RStack_174.m_i;
          local_138.m_matrix[0][0]._0_4_ = local_178.m_i;
          local_138.m_matrix[0][1] = (qreal)CONCAT44(uStack_16c,uStack_170);
          local_138.m_matrix[0][2] = (qreal)CONCAT44(uStack_164,local_168);
          local_138.m_matrix[1][0] = (qreal)CONCAT44(uStack_15c,uStack_160);
          local_158._0_16_ = auVar6;
        }
        (this->styleOptionTmp).exposedRect.w = local_138.m_matrix[0][2];
        (this->styleOptionTmp).exposedRect.h = local_138.m_matrix[1][0];
        (this->styleOptionTmp).exposedRect.xp = local_138.m_matrix[0][0];
        (this->styleOptionTmp).exposedRect.yp = local_138.m_matrix[0][1];
        QPixmap::setDevicePixelRatio(c);
        RVar17.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
        super_QFlagsStorage<QPainter::RenderHint>.i =
             (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
        _q_paintIntoCache((QPixmap *)&local_198,item,(QRegion *)&local_1b8,(QTransform *)local_98,
                          RVar17,&this->styleOptionTmp,painterStateProtection);
        QPixmapCache::insert((QPixmap *)&local_e8);
        QVar35 = (QSize)(pQVar20->key).d;
        (pQVar20->key).d = (KeyData *)local_e8.m_matrix[0][0];
        local_e8.m_matrix[0][0] = (qreal)QVar35;
        QPixmapCache::Key::~Key((Key *)&local_e8);
        pQVar20->allExposed = false;
        QList<QRectF>::clear(&pQVar20->exposed);
        QRegion::~QRegion((QRegion *)&local_1b8);
      }
      if ((dVar48 != dVar46) || (NAN(dVar48) || NAN(dVar46))) {
        QPainter::setOpacity(dVar48);
        local_98[0] = (code *)(double)iVar30;
        local_98[1] = (code *)(double)iVar40;
        QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_98);
        QPainter::setOpacity(dVar46);
        QVar8.x2.m_i = local_1c8.x2.m_i;
        QVar8.y2.m_i = local_1c8.y2.m_i;
        QVar8.x1.m_i = local_1c8.x1.m_i;
        QVar8.y1.m_i = local_1c8.y1.m_i;
      }
      else {
        local_98[0] = (code *)(double)iVar30;
        local_98[1] = (code *)(double)iVar40;
        QPainter::drawPixmap((QPointF *)painter,(QPixmap *)local_98);
        QVar8.x2.m_i = local_1c8.x2.m_i;
        QVar8.y2.m_i = local_1c8.y2.m_i;
        QVar8.x1.m_i = local_1c8.x1.m_i;
        QVar8.y1.m_i = local_1c8.y1.m_i;
      }
    }
    else if (uVar39 == 2) {
      local_1b8.w._0_4_ = 0xffffffff;
      local_1b8.w._4_4_ = 0xffffffff;
      local_1b8.h._0_4_ = 0xffffffff;
      local_1b8.h._4_4_ = 0xffffffff;
      local_1b8.xp = -NAN;
      local_1b8.yp._0_4_ = 0xffffffff;
      local_1b8.yp._4_4_ = 0xffffffff;
      QPainter::worldTransform();
      QTransform::mapRect(&local_1b8);
      dVar59 = (double)((ulong)local_1b8.xp & 0x8000000000000000 | 0x3fe0000000000000) +
               local_1b8.xp;
      dVar57 = 2147483647.0;
      if (dVar59 <= 2147483647.0) {
        dVar57 = dVar59;
      }
      if (dVar57 <= -2147483648.0) {
        dVar57 = -2147483648.0;
      }
      dVar61 = (double)(((ulong)local_1b8.yp._4_4_ & 0x80000000) << 0x20 | 0x3fe0000000000000) +
               (double)CONCAT44(local_1b8.yp._4_4_,local_1b8.yp._0_4_);
      dVar59 = 2147483647.0;
      if (dVar61 <= 2147483647.0) {
        dVar59 = dVar61;
      }
      if (dVar59 <= -2147483648.0) {
        dVar59 = -2147483648.0;
      }
      dVar56 = (local_1b8.xp - (double)(int)dVar57) * 0.5 +
               (double)CONCAT44(local_1b8.w._4_4_,local_1b8.w._0_4_);
      dVar56 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3fe0000000000000) + dVar56;
      dVar61 = 2147483647.0;
      if (dVar56 <= 2147483647.0) {
        dVar61 = dVar56;
      }
      if (dVar61 <= -2147483648.0) {
        dVar61 = -2147483648.0;
      }
      dVar49 = ((double)CONCAT44(local_1b8.yp._4_4_,local_1b8.yp._0_4_) - (double)(int)dVar59) * 0.5
               + (double)CONCAT44(local_1b8.h._4_4_,local_1b8.h._0_4_);
      dVar49 = (double)((ulong)dVar49 & 0x8000000000000000 | 0x3fe0000000000000) + dVar49;
      dVar56 = 2147483647.0;
      if (dVar49 <= 2147483647.0) {
        dVar56 = dVar49;
      }
      if (dVar56 <= -2147483648.0) {
        dVar56 = -2147483648.0;
      }
      local_1c8.x2.m_i = (int)dVar61 + (int)dVar57;
      local_1c8.x1.m_i = (int)dVar57 + -1;
      RVar31.m_i = (int)dVar56 + (int)dVar59;
      RVar27.m_i = (int)dVar59 + -1;
      local_1c8.y1.m_i = RVar27.m_i;
      local_1c8.y2.m_i = RVar31.m_i;
      QVar8.x2.m_i = local_1c8.x2.m_i;
      QVar8.y2.m_i = RVar31.m_i;
      QVar8.x1.m_i = local_1c8.x1.m_i;
      QVar8.y1.m_i = RVar27.m_i;
      auVar58._0_4_ = -(uint)(local_1c8.x2.m_i < local_1c8.x1.m_i);
      auVar58._4_4_ = auVar58._0_4_;
      auVar58._8_4_ = -(uint)(RVar31.m_i < RVar27.m_i);
      auVar58._12_4_ = -(uint)(RVar31.m_i < RVar27.m_i);
      iVar15 = movmskpd(local_1c8.x1.m_i,auVar58);
      if (iVar15 == 0) {
        if (widget == (QWidget *)0x0) {
          local_1d8.x1.m_i = 0;
          local_1d8.y1.m_i = 0;
          local_1d8.x2.m_i = -1;
          local_1d8.y2.m_i = -1;
        }
        else {
          pQVar1 = widget->data;
          local_1d8.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
          local_1d8.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
          local_1d8.x1.m_i = 0;
          local_1d8.y1.m_i = 0;
          cVar14 = QRect::intersects(&local_1d8);
          QVar8.x2.m_i = local_1c8.x2.m_i;
          QVar8.y2.m_i = local_1c8.y2.m_i;
          QVar8.x1.m_i = local_1c8.x1.m_i;
          QVar8.y1.m_i = local_1c8.y1.m_i;
          if (cVar14 == '\0') goto LAB_00619b34;
        }
        uVar44 = (this_00->extras).d.size;
        if (uVar44 == 0) {
LAB_00618dc5:
          local_98[0] = (code *)0x0;
          local_98[1] = (code *)0x0;
          local_98[2] = (code *)0x0;
          local_80 = 9.88131291682493e-324;
        }
        else {
          pEVar32 = (this_00->extras).d.ptr;
          if (pEVar32->type == ExtraMaxDeviceCoordCacheSize) {
            ::QVariant::QVariant((QVariant *)local_98,&pEVar32->value);
          }
          else {
            uVar41 = 0;
            do {
              pEVar2 = pEVar32;
              pEVar32 = pEVar2 + 1;
              if (uVar44 - 1 == uVar41) goto LAB_00618dc5;
              uVar41 = uVar41 + 1;
            } while (pEVar32->type != ExtraMaxDeviceCoordCacheSize);
            ::QVariant::QVariant((QVariant *)local_98,&pEVar2[1].value);
            if (uVar44 <= uVar41) goto LAB_00618dc5;
          }
        }
        uVar21 = ::QVariant::toSize();
        ::QVariant::~QVariant((QVariant *)local_98);
        iVar15 = (int)((ulong)uVar21 >> 0x20);
        if (iVar15 < 1 || (int)uVar21 < 1) {
LAB_00618e1f:
          local_98[0] = (code *)&widget->super_QPaintDevice;
          if (widget == (QWidget *)0x0) {
            local_98[0] = (code *)0x0;
          }
          pDVar22 = QHash<QPaintDevice_*,_QGraphicsItemCache::DeviceData>::operator[]
                              (&pQVar20->deviceData,(QPaintDevice **)local_98);
          local_1d9 = '\x01';
          puVar33 = &DAT_00702c58;
          ppcVar36 = local_98;
          for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
            *ppcVar36 = (code *)*puVar33;
            puVar33 = puVar33 + (ulong)bVar43 * -2 + 1;
            ppcVar36 = ppcVar36 + (ulong)bVar43 * -2 + 1;
          }
          QTransform::inverted((bool *)local_98);
          if (local_1d9 == '\x01') {
            pQVar23 = (QTransform *)QPainter::worldTransform();
            QTransform::operator*=((QTransform *)local_98,pQVar23);
          }
          pqVar24 = (qreal *)QPainter::worldTransform();
          pqVar25 = pqVar24;
          pDVar37 = pDVar22;
          for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
            (pDVar37->lastTransform).m_matrix[0][0] = *pqVar25;
            pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
            pDVar37 = (DeviceData *)((long)pDVar37 + (ulong)bVar43 * -0x10 + 8);
          }
          *(undefined2 *)&(pDVar22->lastTransform).field_0x48 = *(undefined2 *)(pqVar24 + 9);
          if ((local_1d9 == '\x01') && (iVar15 = QTransform::type(), iVar15 < 2)) {
            pQVar23 = (QTransform *)QPainter::worldTransform();
            bVar12 = transformIsSimple(pQVar23);
            if (!bVar12) goto LAB_00618f26;
            auVar52._0_4_ = -(uint)(local_1d8.x2.m_i == local_1d8.x1.m_i + -1);
            iVar15 = -(uint)(local_1d8.y2.m_i == local_1d8.y1.m_i + -1);
            auVar52._4_4_ = auVar52._0_4_;
            auVar52._8_4_ = iVar15;
            auVar52._12_4_ = iVar15;
            iVar15 = movmskpd((int)CONCAT71(extraout_var,bVar12),auVar52);
            if (iVar15 == 3) {
              bVar12 = false;
              uVar39 = 3;
            }
            else {
              uVar39 = (pDVar22->cacheIndent).yp.m_i | (pDVar22->cacheIndent).xp.m_i;
              bVar12 = uVar39 != 0;
            }
            bVar42 = false;
          }
          else {
LAB_00618f26:
            pQVar20->allExposed = true;
            QList<QRectF>::clear(&pQVar20->exposed);
            (pDVar22->cacheIndent).xp = 0;
            (pDVar22->cacheIndent).yp = 0;
            QPixmap::QPixmap((QPixmap *)&local_e8);
            QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
            uVar39 = QPixmap::~QPixmap((QPixmap *)&local_e8);
            bVar42 = true;
            bVar12 = false;
          }
          if (((!bVar12) &&
              (auVar53._0_4_ = -(uint)(local_1d8.x2.m_i == local_1d8.x1.m_i + -1),
              iVar15 = -(uint)(local_1d8.y2.m_i == local_1d8.y1.m_i + -1),
              auVar53._4_4_ = auVar53._0_4_, auVar53._8_4_ = iVar15, auVar53._12_4_ = iVar15,
              iVar15 = movmskpd(uVar39,auVar53), iVar15 != 3)) &&
             (cVar14 = QRect::contains(&local_1d8,SUB81(&local_1c8,0)), cVar14 == '\0')) {
            bVar12 = true;
            if ((double)((local_1c8.x2.m_i - local_1c8.x1.m_i) + 1) <=
                (double)((local_1d8.x2.m_i - local_1d8.x1.m_i) + 1) * 1.2) {
              bVar12 = (double)((local_1d8.y2.m_i - local_1d8.y1.m_i) + 1) * 1.2 <
                       (double)((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1);
            }
          }
          local_1e8.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&local_1e8);
          if (bVar12) {
            QVar3 = (QPoint)(CONCAT44(local_1d8.y1.m_i - local_1c8.y1.m_i,
                                      local_1d8.x1.m_i - local_1c8.x1.m_i) &
                            CONCAT44(-(uint)(local_1c8.y1.m_i < local_1d8.y1.m_i),
                                     -(uint)(local_1c8.x1.m_i < local_1d8.x1.m_i)));
            local_1c8 = (QRect)QRect::operator&(&local_1c8,&local_1d8);
            uVar18 = QPixmap::isNull();
            if ((char)uVar18 != '\0') {
              (pDVar22->cacheIndent).xp = 0;
              (pDVar22->cacheIndent).yp = 0;
              pQVar20->allExposed = true;
              QList<QRectF>::clear(&pQVar20->exposed);
              bVar42 = true;
              uVar18 = extraout_EAX;
            }
            local_2a8 = QVar3.xp.m_i;
            RStack_2a4 = QVar3.yp.m_i;
            auVar54._0_4_ = -(uint)((pDVar22->cacheIndent).xp.m_i == local_2a8.m_i);
            iVar15 = -(uint)((pDVar22->cacheIndent).yp.m_i == RStack_2a4.m_i);
            auVar54._4_4_ = auVar54._0_4_;
            auVar54._8_4_ = iVar15;
            auVar54._12_4_ = iVar15;
            iVar15 = movmskpd(uVar18,auVar54);
            if (iVar15 == 3) {
              iVar45 = local_1c8.x2.m_i - local_1c8.x1.m_i;
              iVar15 = local_1c8.y2.m_i - local_1c8.y1.m_i;
              local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
              QVar35 = operator/((QSize *)&local_e8,c);
              if ((iVar45 + 1 != QVar35.wd.m_i.m_i) || (iVar15 + 1 != QVar35.ht.m_i.m_i))
              goto LAB_006190e9;
            }
            else {
LAB_006190e9:
              uVar39 = local_2a8.m_i - (pDVar22->cacheIndent).xp;
              uVar60 = RStack_2a4.m_i - (pDVar22->cacheIndent).yp;
              local_e8.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_e8.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_e8.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              local_158.xp = (qreal)CONCAT44((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1,
                                             (local_1c8.x2.m_i - local_1c8.x1.m_i) + 1);
              local_138.m_matrix[0][0] = (qreal)operator*((QSize *)&local_158,c);
              QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)&local_138);
              QColor::QColor((QColor *)&local_138,transparent);
              QPixmap::fill((QColor *)&local_e8);
              cVar14 = QPixmap::isNull();
              if (cVar14 == '\0') {
                QPixmap::setDevicePixelRatio(c);
                local_158.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                QPainter::QPainter((QPainter *)&local_158,(QPaintDevice *)&local_e8);
                local_138.m_matrix[0][0] = (qreal)(int)-uVar39;
                local_138.m_matrix[0][1] = (qreal)(int)-uVar60;
                QPainter::drawPixmap((QPointF *)&local_158,(QPixmap *)&local_138);
                QPainter::end();
                QPainter::~QPainter((QPainter *)&local_158);
              }
              local_158.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
              QRegion::QRegion((QRegion *)&local_158);
              local_218._0_8_ = QPixmap::size();
              QVar35 = operator/((QSize *)local_218,c);
              local_138.m_matrix[0][0] = 0.0;
              local_138.m_matrix[0][1] =
                   (qreal)CONCAT44(QVar35.ht.m_i.m_i + -1,QVar35.wd.m_i.m_i + -1);
              QRegion::operator+=((QRegion *)&local_158,(QRect *)&local_138);
              cVar14 = QPixmap::isNull();
              if (cVar14 == '\0') {
                local_238 = (QSize)QPixmap::size();
                QVar35 = operator/(&local_238,c);
                local_138.m_matrix[0][1] =
                     (qreal)CONCAT44((uVar60 ^ 0xffffffff) + QVar35.ht.m_i.m_i,
                                     (uVar39 ^ 0xffffffff) + QVar35.wd.m_i.m_i);
                local_138.m_matrix[0][0]._4_4_ = -uVar60;
                local_138.m_matrix[0][0]._0_4_ = -uVar39;
                QRegion::QRegion((QRegion *)local_218,(QRect *)&local_138,Rectangle);
                QRegion::operator-=((QRegion *)&local_158,(QRegion *)local_218);
                QRegion::~QRegion((QRegion *)local_218);
              }
              QRegion::operator=(&local_1e8,(QRegion *)&local_158);
              QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
              QRegion::~QRegion((QRegion *)&local_158);
              QPixmap::~QPixmap((QPixmap *)&local_e8);
              bVar42 = true;
            }
            pDVar22->cacheIndent = QVar3;
            QVar7 = local_1c8;
          }
          else {
            (pDVar22->cacheIndent).xp = 0;
            (pDVar22->cacheIndent).yp = 0;
            iVar45 = local_1c8.x2.m_i - local_1c8.x1.m_i;
            iVar15 = local_1c8.y2.m_i - local_1c8.y1.m_i;
            local_e8.m_matrix[0][0] = (qreal)QPixmap::size();
            QVar35 = operator/((QSize *)&local_e8,c);
            QVar7.x2.m_i = local_1c8.x2.m_i;
            QVar7.y2.m_i = local_1c8.y2.m_i;
            QVar7.x1.m_i = local_1c8.x1.m_i;
            QVar7.y1.m_i = local_1c8.y1.m_i;
            if ((iVar45 + 1 != QVar35.wd.m_i.m_i) || (iVar15 + 1 != QVar35.ht.m_i.m_i)) {
              local_158.xp = (qreal)CONCAT44((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1,
                                             (local_1c8.x2.m_i - local_1c8.x1.m_i) + 1);
              local_138.m_matrix[0][0] = (qreal)operator*((QSize *)&local_158,c);
              QPixmap::QPixmap((QPixmap *)&local_e8,(QSize *)&local_138);
              QPixmap::operator=((QPixmap *)&local_198,(QPixmap *)&local_e8);
              QPixmap::~QPixmap((QPixmap *)&local_e8);
              pQVar20->allExposed = true;
              QList<QRectF>::clear(&pQVar20->exposed);
              QVar7.x2.m_i = local_1c8.x2.m_i;
              QVar7.y2.m_i = local_1c8.y2.m_i;
              QVar7.x1.m_i = local_1c8.x1.m_i;
              QVar7.y1.m_i = local_1c8.y1.m_i;
              bVar42 = true;
            }
          }
          local_1c8 = QVar7;
          if ((pQVar20->allExposed == false) && ((pQVar20->exposed).d.size == 0)) {
            cVar14 = QRegion::isEmpty();
            if (cVar14 == '\0') goto LAB_0061953c;
          }
          else {
LAB_0061953c:
            if (cVar13 != '\0') {
              QPixmapCache::remove(&local_180);
            }
            RVar27.m_i = local_1c8.x1.m_i;
            RVar31.m_i = local_1c8.y1.m_i;
            pqVar25 = (qreal *)&DAT_00702c58;
            pQVar23 = &local_e8;
            for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
              pQVar23->m_matrix[0][0] = *pqVar25;
              pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
              pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar43 * -2 + 1) * 8);
            }
            pqVar25 = (qreal *)QPainter::worldTransform();
            pQVar23 = &local_e8;
            for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
              pQVar23->m_matrix[0][0] = *pqVar25;
              pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
              pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar43 * -2 + 1) * 8);
            }
            if (RVar27.m_i != 0 || RVar31.m_i != 0) {
              QTransform::fromTranslate(-(double)RVar27.m_i,-(double)RVar31.m_i);
              QTransform::operator*=(&local_e8,&local_138);
            }
            local_1f0.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_1f0,&local_1e8);
            if ((pQVar20->allExposed == false) && (lVar28 = (pQVar20->exposed).d.size, lVar28 != 0))
            {
              lVar28 = lVar28 << 5;
              do {
                QTransform::mapRect((QRectF *)&local_138);
                dVar59 = (double)((ulong)local_138.m_matrix[0][0] & 0x8000000000000000 |
                                 0x3fe0000000000000) + local_138.m_matrix[0][0];
                dVar57 = 2147483647.0;
                if (dVar59 <= 2147483647.0) {
                  dVar57 = dVar59;
                }
                if (dVar57 <= -2147483648.0) {
                  dVar57 = -2147483648.0;
                }
                dVar61 = (double)((ulong)local_138.m_matrix[0][1] & 0x8000000000000000 |
                                 0x3fe0000000000000) + local_138.m_matrix[0][1];
                dVar59 = 2147483647.0;
                if (dVar61 <= 2147483647.0) {
                  dVar59 = dVar61;
                }
                if (dVar59 <= -2147483648.0) {
                  dVar59 = -2147483648.0;
                }
                dVar56 = (local_138.m_matrix[0][0] - (double)(int)dVar57) * 0.5 +
                         local_138.m_matrix[0][2];
                dVar56 = (double)((ulong)dVar56 & 0x8000000000000000 | 0x3fe0000000000000) + dVar56;
                dVar61 = 2147483647.0;
                if (dVar56 <= 2147483647.0) {
                  dVar61 = dVar56;
                }
                if (dVar61 <= -2147483648.0) {
                  dVar61 = -2147483648.0;
                }
                dVar49 = (local_138.m_matrix[0][1] - (double)(int)dVar59) * 0.5 +
                         local_138.m_matrix[1][0];
                dVar49 = (double)((ulong)dVar49 & 0x8000000000000000 | 0x3fe0000000000000) + dVar49;
                dVar56 = 2147483647.0;
                if (dVar49 <= 2147483647.0) {
                  dVar56 = dVar49;
                }
                if (dVar56 <= -2147483648.0) {
                  dVar56 = -2147483648.0;
                }
                local_158.xp = (qreal)CONCAT44((int)dVar59 + -1,(int)dVar57 + -1);
                local_158.yp = (qreal)CONCAT44((int)dVar56 + (int)dVar59,(int)dVar61 + (int)dVar57);
                QRegion::operator+=(&local_1f0,(QRect *)&local_158);
                lVar28 = lVar28 + -0x20;
              } while (lVar28 != 0);
            }
            local_218._0_16_ = (undefined1  [16])0x0;
            stack0xfffffffffffffdf8 = (undefined1  [16])0x0;
            if (pQVar20->allExposed == true) {
              (*item->_vptr_QGraphicsItem[3])(local_218,item);
            }
            else {
              lVar28 = (pQVar20->exposed).d.size;
              if (lVar28 != 0) {
                lVar28 = lVar28 << 5;
                do {
                  QRectF::operator|((QRectF *)&local_138,(QRectF *)local_218);
                  qStack_200 = local_138.m_matrix[1][0];
                  local_218._16_8_ = local_138.m_matrix[0][2];
                  local_218._8_8_ = local_138.m_matrix[0][1];
                  local_218._0_8_ = local_138.m_matrix[0][0];
                  lVar28 = lVar28 + -0x20;
                } while (lVar28 != 0);
              }
              pqVar25 = (qreal *)&DAT_00702c58;
              pQVar23 = &local_138;
              for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
                pQVar23->m_matrix[0][0] = *pqVar25;
                pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
                pQVar23 = (QTransform *)((long)pQVar23 + (ulong)bVar43 * -0x10 + 8);
              }
              QTransform::inverted((bool *)&local_138);
              lVar28 = QRegion::begin();
              lVar26 = QRegion::end();
              if (lVar28 != lVar26) {
                do {
                  auVar62 = QTransform::mapRect((QRect *)&local_138);
                  local_238 = (QSize)(double)auVar62._0_4_;
                  local_230 = (double)auVar62._4_4_;
                  local_228 = (double)(((long)auVar62._8_4_ - (long)auVar62._0_4_) + 1);
                  local_220 = (double)(((auVar62._8_8_ >> 0x20) - (auVar62._0_8_ >> 0x20)) + 1);
                  QRectF::operator|(&local_158,(QRectF *)local_218);
                  qStack_200 = local_158.h;
                  local_218._16_8_ = local_158.w;
                  local_218._8_8_ = local_158.yp;
                  local_218._0_8_ = local_158.xp;
                  lVar28 = lVar28 + 0x10;
                } while (lVar28 != lVar26);
              }
            }
            QStyleOption::operator=
                      (&(this->styleOptionTmp).super_QStyleOption,&option->super_QStyleOption);
            qVar47 = (option->exposedRect).yp;
            qVar4 = (option->exposedRect).w;
            qVar5 = (option->exposedRect).h;
            (this->styleOptionTmp).exposedRect.xp = (option->exposedRect).xp;
            (this->styleOptionTmp).exposedRect.yp = qVar47;
            (this->styleOptionTmp).exposedRect.w = qVar4;
            (this->styleOptionTmp).exposedRect.h = qVar5;
            (this->styleOptionTmp).exposedRect.xp = (double)local_218._0_8_ + -1.0;
            (this->styleOptionTmp).exposedRect.yp = (double)local_218._8_8_ + -1.0;
            (this->styleOptionTmp).exposedRect.w = (double)local_218._16_8_ + 1.0 + 1.0;
            (this->styleOptionTmp).exposedRect.h = qStack_200 + 1.0 + 1.0;
            QPixmap::setDevicePixelRatio(c);
            RVar17.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
            super_QFlagsStorage<QPainter::RenderHint>.i =
                 (QFlagsStorageHelper<QPainter::RenderHint,_4>)QPainter::renderHints();
            _q_paintIntoCache((QPixmap *)&local_198,item,&local_1f0,&local_e8,RVar17,
                              &this->styleOptionTmp,painterStateProtection);
            pQVar20->allExposed = false;
            QList<QRectF>::clear(&pQVar20->exposed);
            QRegion::~QRegion(&local_1f0);
            bVar42 = true;
          }
          if (bVar42) {
            QPixmapCache::insert((QPixmap *)&local_e8);
            QVar35 = (QSize)(pDVar22->key).d;
            (pDVar22->key).d = (KeyData *)local_e8.m_matrix[0][0];
            local_e8.m_matrix[0][0] = (qreal)QVar35;
            QPixmapCache::Key::~Key((Key *)&local_e8);
          }
          pqVar25 = (qreal *)&DAT_00702c58;
          pQVar23 = &local_e8;
          for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
            pQVar23->m_matrix[0][0] = *pqVar25;
            pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
            pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar43 * -2 + 1) * 8);
          }
          pqVar25 = (qreal *)QPainter::worldTransform();
          pQVar23 = &local_e8;
          for (lVar28 = 10; lVar28 != 0; lVar28 = lVar28 + -1) {
            pQVar23->m_matrix[0][0] = *pqVar25;
            pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
            pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar43 * -2 + 1) * 8);
          }
          pqVar25 = (qreal *)&DAT_00702c10;
          pQVar23 = &local_138;
          for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
            pQVar23->m_matrix[0][0] = *pqVar25;
            pqVar25 = pqVar25 + (ulong)bVar43 * -2 + 1;
            pQVar23 = (QTransform *)((long)pQVar23 + ((ulong)bVar43 * -2 + 1) * 8);
          }
          local_138._72_2_ = local_138._72_2_ & 0xfc00;
          QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_138,0));
          if ((dVar48 != dVar46) || (NAN(dVar48) || NAN(dVar46))) {
            QPainter::setOpacity(dVar48);
            local_138.m_matrix[0][0] = (qreal)local_1c8.x1.m_i.m_i;
            local_138.m_matrix[0][1] = (qreal)local_1c8.y1.m_i.m_i;
            QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_138);
            QPainter::setOpacity(dVar46);
          }
          else {
            local_138.m_matrix[0][0] = (qreal)local_1c8.x1.m_i.m_i;
            local_138.m_matrix[0][1] = (qreal)local_1c8.y1.m_i.m_i;
            QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_138);
          }
          QPainter::setWorldTransform((QTransform *)painter,SUB81(&local_e8,0));
          QRegion::~QRegion(&local_1e8);
          QVar8 = local_1c8;
        }
        else {
          if ((local_1c8.x2.m_i - local_1c8.x1.m_i) + 1 <= (int)uVar21) {
            if ((local_1c8.y2.m_i - local_1c8.y1.m_i) + 1 <= iVar15) goto LAB_00618e1f;
          }
          _q_paintItem(item,painter,option,widget,(bool)(-(dVar46 != dVar48) & 1),
                       painterStateProtection);
          QVar8.x2.m_i = local_1c8.x2.m_i;
          QVar8.y2.m_i = local_1c8.y2.m_i;
          QVar8.x1.m_i = local_1c8.x1.m_i;
          QVar8.y1.m_i = local_1c8.y1.m_i;
        }
      }
    }
LAB_00619b34:
    local_1c8 = QVar8;
    QPixmap::~QPixmap((QPixmap *)&local_198);
    QPixmapCache::Key::~Key(&local_180);
    QVar9 = local_1c8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00619b85:
  local_1c8 = QVar9;
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::drawItemHelper(QGraphicsItem *item, QPainter *painter,
                                           const QStyleOptionGraphicsItem *option, QWidget *widget,
                                           bool painterStateProtection)
{
    QGraphicsItemPrivate *itemd = item->d_ptr.data();
    QGraphicsItem::CacheMode cacheMode = QGraphicsItem::CacheMode(itemd->cacheMode);

    // Render directly, using no cache.
    if (cacheMode == QGraphicsItem::NoCache) {
        _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget, true, painterStateProtection);
        return;
    }

    const qreal devicePixelRatio = painter->device()->devicePixelRatio();
    const qreal oldPainterOpacity = painter->opacity();
    qreal newPainterOpacity = oldPainterOpacity;
    QGraphicsProxyWidget *proxy = item->isWidget() ? qobject_cast<QGraphicsProxyWidget *>(static_cast<QGraphicsWidget *>(item)) : 0;
    if (proxy && proxy->widget()) {
        const qreal windowOpacity = proxy->widget()->windowOpacity();
        if (windowOpacity < 1.0)
            newPainterOpacity *= windowOpacity;
    }

    // Item's (local) bounding rect
    QRectF brect = item->boundingRect();
    QRectF adjustedBrect(brect);
    _q_adjustRect(&adjustedBrect);
    if (adjustedBrect.isEmpty())
        return;

    // Fetch the off-screen transparent buffer and exposed area info.
    QPixmapCache::Key pixmapKey;
    QPixmap pix;

    bool pixmapFound;
    QGraphicsItemCache *itemCache = itemd->extraItemCache();
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        pixmapKey = itemCache->key;
    } else {
        pixmapKey = itemCache->deviceData.value(widget).key;
    }

    // Find pixmap in cache.
    pixmapFound = QPixmapCache::find(pixmapKey, &pix);

    // Render using item coordinate cache mode.
    if (cacheMode == QGraphicsItem::ItemCoordinateCache) {
        QSize pixmapSize;
        bool fixedCacheSize = itemCache->fixedSize.isValid();
        QRect br = brect.toAlignedRect();
        if (fixedCacheSize) {
            pixmapSize = itemCache->fixedSize;
        } else {
            pixmapSize = br.size();
        }

        pixmapSize *= devicePixelRatio;

        // Create or recreate the pixmap.
        int adjust = itemCache->fixedSize.isValid() ? 0 : 2;
        QSize adjustSize(adjust*2, adjust*2);
        br.adjust(-adjust / devicePixelRatio, -adjust / devicePixelRatio, adjust / devicePixelRatio, adjust / devicePixelRatio);
        if (pix.isNull() || (!fixedCacheSize && (pixmapSize + adjustSize) != pix.size())) {
            pix = QPixmap(pixmapSize + adjustSize);
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        } else if (itemCache->boundingRect != br) {
            itemCache->boundingRect = br;
            itemCache->exposed.clear();
            itemCache->allExposed = true;
        }

        // Redraw any newly exposed areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty()) {

            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Fit the item's bounding rect into the pixmap's coordinates.
            QTransform itemToPixmap;
            if (fixedCacheSize) {
                const QPointF scale((pixmapSize.width() / devicePixelRatio) / brect.width(),
                                    (pixmapSize.height() / devicePixelRatio) / brect.height());
                itemToPixmap.scale(scale.x(), scale.y());
            }
            itemToPixmap.translate(-br.x(), -br.y());

            // Generate the item's exposedRect and map its list of expose
            // rects to device coordinates.
            styleOptionTmp = *option;
            QRegion pixmapExposed;
            QRectF exposedRect;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed)) {
                    exposedRect |= rect;
                    pixmapExposed += itemToPixmap.mapRect(rect).toAlignedRect();
                }
            } else {
                exposedRect = brect;
            }
            styleOptionTmp.exposedRect = exposedRect;

            // Render.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // insert this pixmap into the cache.
            itemCache->key = QPixmapCache::insert(pix);

            // Reset expose data.
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        // Redraw the exposed area using the transformed painter. Depending on
        // the hardware, this may be a server-side operation, or an expensive
        // qpixmap-image-transform-pixmap roundtrip.
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(br.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(br.topLeft(), pix);
        }
        return;
    }

    // Render using device coordinate cache mode.
    if (cacheMode == QGraphicsItem::DeviceCoordinateCache) {
        // Find the item's bounds in device coordinates.
        QRectF deviceBounds = painter->worldTransform().mapRect(brect);
        QRect deviceRect = deviceBounds.toRect().adjusted(-1, -1, 1, 1);
        if (deviceRect.isEmpty())
            return;
        QRect viewRect = widget ? widget->rect() : QRect();
        if (widget && !viewRect.intersects(deviceRect))
            return;

        // Resort to direct rendering if the device rect exceeds the
        // (optional) maximum bounds. (QGraphicsSvgItem uses this).
        QSize maximumCacheSize =
            itemd->extra(QGraphicsItemPrivate::ExtraMaxDeviceCoordCacheSize).toSize();
        if (!maximumCacheSize.isEmpty()
            && (deviceRect.width() > maximumCacheSize.width()
                || deviceRect.height() > maximumCacheSize.height())) {
            _q_paintItem(static_cast<QGraphicsWidget *>(item), painter, option, widget,
                         oldPainterOpacity != newPainterOpacity, painterStateProtection);
            return;
        }

        // Create or reuse offscreen pixmap, possibly scroll/blit from the old one.
        // If the world transform is rotated we always recreate the cache to avoid
        // wrong blending.
        bool pixModified = false;
        QGraphicsItemCache::DeviceData *deviceData = &itemCache->deviceData[widget];
        bool invertable = true;
        QTransform diff = deviceData->lastTransform.inverted(&invertable);
        if (invertable)
            diff *= painter->worldTransform();
        deviceData->lastTransform = painter->worldTransform();
        bool allowPartialCacheExposure = false;
        bool simpleTransform = invertable && diff.type() <= QTransform::TxTranslate
                               && transformIsSimple(painter->worldTransform());
        if (!simpleTransform) {
            pixModified = true;
            itemCache->allExposed = true;
            itemCache->exposed.clear();
            deviceData->cacheIndent = QPoint();
            pix = QPixmap();
        } else if (!viewRect.isNull()) {
            allowPartialCacheExposure = deviceData->cacheIndent != QPoint();
        }

        // Allow partial cache exposure if the device rect isn't fully contained and
        // deviceRect is 20% taller or wider than the viewRect.
        if (!allowPartialCacheExposure && !viewRect.isNull() && !viewRect.contains(deviceRect)) {
            allowPartialCacheExposure = (viewRect.width() * 1.2 < deviceRect.width())
                                         || (viewRect.height() * 1.2 < deviceRect.height());
        }

        QRegion scrollExposure;
        if (allowPartialCacheExposure) {
            // Part of pixmap is drawn. Either device contains viewrect (big
            // item covers whole screen) or parts of device are outside the
            // viewport. In either case the device rect must be the intersect
            // between the two.
            int dx = deviceRect.left() < viewRect.left() ? viewRect.left() - deviceRect.left() : 0;
            int dy = deviceRect.top() < viewRect.top() ? viewRect.top() - deviceRect.top() : 0;
            QPoint newCacheIndent(dx, dy);
            deviceRect &= viewRect;

            if (pix.isNull()) {
                deviceData->cacheIndent = QPoint();
                itemCache->allExposed = true;
                itemCache->exposed.clear();
                pixModified = true;
            }

            // Copy / "scroll" the old pixmap onto the new ole and calculate
            // scrolled exposure.
            if (newCacheIndent != deviceData->cacheIndent || deviceRect.size() != pix.size() / devicePixelRatio) {
                QPoint diff = newCacheIndent - deviceData->cacheIndent;
                QPixmap newPix(deviceRect.size() * devicePixelRatio);
                // ### Investigate removing this fill (test with Plasma and
                // graphicssystem raster).
                newPix.fill(Qt::transparent);
                if (!pix.isNull()) {
                    newPix.setDevicePixelRatio(devicePixelRatio);
                    QPainter newPixPainter(&newPix);
                    newPixPainter.drawPixmap(-diff, pix);
                    newPixPainter.end();
                }
                QRegion exposed;
                exposed += QRect(QPoint(0,0), newPix.size() / devicePixelRatio);
                if (!pix.isNull())
                    exposed -= QRect(-diff, pix.size() / devicePixelRatio);
                scrollExposure = exposed;

                pix = newPix;
                pixModified = true;
            }
            deviceData->cacheIndent = newCacheIndent;
        } else {
            // Full pixmap is drawn.
            deviceData->cacheIndent = QPoint();

            // Auto-adjust the pixmap size.
            if (deviceRect.size() != pix.size() / devicePixelRatio) {
                // exposed needs to cover the whole pixmap
                pix = QPixmap(deviceRect.size() * devicePixelRatio);
                pixModified = true;
                itemCache->allExposed = true;
                itemCache->exposed.clear();
            }
        }

        // Check for newly invalidated areas.
        if (itemCache->allExposed || !itemCache->exposed.isEmpty() || !scrollExposure.isEmpty()) {
            //We know that we will modify the pixmap, removing it from the cache
            //will detach the one we have and avoid a deep copy
            if (pixmapFound)
                QPixmapCache::remove(pixmapKey);

            // Construct an item-to-pixmap transform.
            QPointF p = deviceRect.topLeft();
            QTransform itemToPixmap = painter->worldTransform();
            if (!p.isNull())
                itemToPixmap *= QTransform::fromTranslate(-p.x(), -p.y());

            // Map the item's logical expose to pixmap coordinates.
            QRegion pixmapExposed = scrollExposure;
            if (!itemCache->allExposed) {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    pixmapExposed += itemToPixmap.mapRect(rect).toRect().adjusted(-1, -1, 1, 1);
            }

            // Calculate the style option's exposedRect.
            QRectF br;
            if (itemCache->allExposed) {
                br = item->boundingRect();
            } else {
                for (const auto &rect : std::as_const(itemCache->exposed))
                    br |= rect;
                QTransform pixmapToItem = itemToPixmap.inverted();
                for (const QRect &r : std::as_const(scrollExposure))
                    br |= pixmapToItem.mapRect(r);
            }
            styleOptionTmp = *option;
            styleOptionTmp.exposedRect = br.adjusted(-1, -1, 1, 1);

            // Render the exposed areas.
            pix.setDevicePixelRatio(devicePixelRatio);
            _q_paintIntoCache(&pix, item, pixmapExposed, itemToPixmap, painter->renderHints(),
                              &styleOptionTmp, painterStateProtection);

            // Reset expose data.
            pixModified = true;
            itemCache->allExposed = false;
            itemCache->exposed.clear();
        }

        if (pixModified) {
            // Insert this pixmap into the cache.
            deviceData->key = QPixmapCache::insert(pix);
        }

        // Redraw the exposed area using an untransformed painter. This
        // effectively becomes a bitblit that does not transform the cache.
        QTransform restoreTransform = painter->worldTransform();
        painter->setWorldTransform(QTransform());
        if (newPainterOpacity != oldPainterOpacity) {
            painter->setOpacity(newPainterOpacity);
            painter->drawPixmap(deviceRect.topLeft(), pix);
            painter->setOpacity(oldPainterOpacity);
        } else {
            painter->drawPixmap(deviceRect.topLeft(), pix);
        }
        painter->setWorldTransform(restoreTransform);
        return;
    }
}